

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutTests.cpp
# Opt level: O2

void __thiscall
vkt::ssbo::anon_unknown_0::BlockSingleNestedStructCase::BlockSingleNestedStructCase
          (BlockSingleNestedStructCase *this,TestContext *testCtx,char *name,char *description,
          deUint32 layoutFlags,BufferMode bufferMode,int numInstances,MatrixLoadFlags matrixLoadFlag
          )

{
  ShaderInterface *this_00;
  vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_> *this_01;
  StructType *this_02;
  StructType *this_03;
  BufferBlock *this_04;
  VarType local_80;
  BufferVar local_68;
  
  SSBOLayoutCase::SSBOLayoutCase
            (&this->super_SSBOLayoutCase,testCtx,name,"",layoutFlags,numInstances);
  (this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SSBOLayoutCase_00c03ba0;
  this->m_layoutFlags = (deUint32)description;
  this->m_numInstances = bufferMode;
  this_00 = &(this->super_SSBOLayoutCase).m_interface;
  this_02 = ShaderInterface::allocStruct(this_00,"S");
  glu::VarType::VarType((VarType *)&local_68,TYPE_INT_VEC3,PRECISION_HIGHP);
  glu::StructType::addMember(this_02,"a",(VarType *)&local_68);
  glu::VarType::~VarType((VarType *)&local_68);
  glu::VarType::VarType(&local_80,TYPE_FLOAT_MAT3,PRECISION_MEDIUMP);
  glu::VarType::VarType((VarType *)&local_68,&local_80,4);
  glu::StructType::addMember(this_02,"b",(VarType *)&local_68);
  glu::VarType::~VarType((VarType *)&local_68);
  glu::VarType::~VarType(&local_80);
  glu::VarType::VarType((VarType *)&local_68,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(this_02,"c",(VarType *)&local_68);
  glu::VarType::~VarType((VarType *)&local_68);
  this_03 = ShaderInterface::allocStruct(this_00,"T");
  glu::VarType::VarType((VarType *)&local_68,TYPE_FLOAT_MAT3,PRECISION_MEDIUMP);
  glu::StructType::addMember(this_03,"a",(VarType *)&local_68);
  glu::VarType::~VarType((VarType *)&local_68);
  glu::VarType::VarType((VarType *)&local_68,this_02);
  glu::StructType::addMember(this_03,"b",(VarType *)&local_68);
  glu::VarType::~VarType((VarType *)&local_68);
  this_04 = ShaderInterface::allocBlock(this_00,"Block");
  glu::VarType::VarType(&local_80,this_02);
  BufferVar::BufferVar(&local_68,"s",&local_80,0x200);
  this_01 = &this_04->m_variables;
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (this_01,&local_68);
  BufferVar::~BufferVar(&local_68);
  glu::VarType::~VarType(&local_80);
  glu::VarType::VarType(&local_80,TYPE_FLOAT_VEC2,PRECISION_LOWP);
  BufferVar::BufferVar(&local_68,"v",&local_80,0);
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (this_01,&local_68);
  BufferVar::~BufferVar(&local_68);
  glu::VarType::~VarType(&local_80);
  glu::VarType::VarType(&local_80,this_03);
  BufferVar::BufferVar(&local_68,"t",&local_80,0x600);
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (this_01,&local_68);
  BufferVar::~BufferVar(&local_68);
  glu::VarType::~VarType(&local_80);
  glu::VarType::VarType(&local_80,TYPE_UINT,PRECISION_HIGHP);
  BufferVar::BufferVar(&local_68,"u",&local_80,0x400);
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (this_01,&local_68);
  BufferVar::~BufferVar(&local_68);
  glu::VarType::~VarType(&local_80);
  this_04->m_flags = this->m_layoutFlags;
  if (0 < this->m_numInstances) {
    std::__cxx11::string::assign((char *)&this_04->m_instanceName);
    BufferBlock::setArraySize(this_04,this->m_numInstances);
  }
  (*(this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[2])
            (this);
  return;
}

Assistant:

BlockSingleNestedStructCase (tcu::TestContext& testCtx, const char* name, const char* description, deUint32 layoutFlags, BufferMode bufferMode, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: SSBOLayoutCase	(testCtx, name, description, bufferMode, matrixLoadFlag)
		, m_layoutFlags		(layoutFlags)
		, m_numInstances	(numInstances)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, glu::PRECISION_HIGHP));
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_MAT3, glu::PRECISION_MEDIUMP), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP)); // \todo [pyry] UNUSED

		StructType& typeT = m_interface.allocStruct("T");
		typeT.addMember("a", VarType(glu::TYPE_FLOAT_MAT3, glu::PRECISION_MEDIUMP));
		typeT.addMember("b", VarType(&typeS));

		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("s", VarType(&typeS), ACCESS_READ));
		block.addMember(BufferVar("v", VarType(glu::TYPE_FLOAT_VEC2, glu::PRECISION_LOWP), 0 /* no access */));
		block.addMember(BufferVar("t", VarType(&typeT), ACCESS_READ|ACCESS_WRITE));
		block.addMember(BufferVar("u", VarType(glu::TYPE_UINT, glu::PRECISION_HIGHP), ACCESS_WRITE));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}

		init();
	}